

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

bool embree::extend_grid(RTCGeometry geom,vector<bool,_std::allocator<bool>_> *visited,
                        deque<unsigned_int,_std::allocator<unsigned_int>_> *left,
                        deque<unsigned_int,_std::allocator<unsigned_int>_> *top,
                        deque<unsigned_int,_std::allocator<unsigned_int>_> *right)

{
  ulong uVar1;
  ulong *puVar2;
  _Map_pointer ppuVar3;
  _Map_pointer ppuVar4;
  _Elt_pointer puVar5;
  bool bVar6;
  RTCGeometry pRVar7;
  uint uVar8;
  undefined4 uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  uint *puVar13;
  long lVar14;
  size_t i;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  uint next_edge;
  uint local_6c;
  ulong local_68;
  uint local_5c;
  RTCGeometry local_58;
  int local_4c;
  vector<bool,_std::allocator<bool>_> *local_48;
  deque<unsigned_int,std::allocator<unsigned_int>> *local_40;
  deque<unsigned_int,std::allocator<unsigned_int>> *local_38;
  
  local_5c = 0xffffffff;
  lVar17 = 0;
  uVar12 = 0;
  local_58 = geom;
  local_48 = visited;
  local_40 = (deque<unsigned_int,std::allocator<unsigned_int>> *)right;
  local_38 = (deque<unsigned_int,std::allocator<unsigned_int>> *)left;
  while( true ) {
    pRVar7 = local_58;
    ppuVar3 = (top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    ppuVar4 = (top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Deque_impl_data._M_start._M_node;
    puVar5 = (top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    uVar16 = ((long)(top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Deque_impl_data._M_start._M_last - (long)puVar5 >> 2) +
             ((long)(top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Deque_impl_data._M_finish._M_cur -
              (long)(top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Deque_impl_data._M_finish._M_first >> 2) +
             ((((ulong)((long)ppuVar3 - (long)ppuVar4) >> 3) - 1) +
             (ulong)(ppuVar3 == (_Map_pointer)0x0)) * 0x80;
    local_68 = uVar12;
    if (uVar16 <= uVar12) break;
    lVar14 = (long)puVar5 -
             (long)(top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Deque_impl_data._M_start._M_first >> 2;
    uVar1 = uVar12 + lVar14;
    if (uVar1 < 0x80) {
      puVar13 = (uint *)((long)puVar5 + lVar17);
    }
    else {
      uVar15 = uVar1 >> 7 | 0xfe00000000000000;
      if (0 < (long)uVar1) {
        uVar15 = uVar1 >> 7;
      }
      puVar13 = ppuVar4[uVar15] + lVar14 + uVar15 * -0x80 + uVar12;
    }
    uVar11 = *puVar13;
    uVar8 = rtcGetGeometryOppositeHalfEdge(local_58,0,uVar11);
    if ((uVar8 == uVar11) ||
       (uVar12 = rtcGetGeometryFace(pRVar7,uVar8), pRVar7 = local_58,
       ((local_48->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[uVar12 >> 6 & 0x3ffffff] >> (uVar12 & 0x3f) & 1) != 0
       )) {
      bVar6 = false;
      uVar12 = local_68;
    }
    else {
      uVar12 = local_68;
      if (local_68 != 0) {
        uVar9 = rtcGetGeometryPreviousHalfEdge(local_58,local_5c);
        bVar6 = false;
        local_4c = rtcGetGeometryOppositeHalfEdge(pRVar7,0,uVar9);
        uVar12 = local_68;
        iVar10 = rtcGetGeometryNextHalfEdge(pRVar7,uVar8);
        if (local_4c != iVar10) goto LAB_0014e3ae;
      }
      bVar6 = true;
      local_5c = uVar8;
    }
LAB_0014e3ae:
    uVar12 = uVar12 + 1;
    lVar17 = lVar17 + 4;
    if (!bVar6) goto LAB_0014e60f;
  }
  lVar17 = 0;
  uVar12 = 0;
  while( true ) {
    pRVar7 = local_58;
    ppuVar3 = (top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    ppuVar4 = (top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Deque_impl_data._M_start._M_node;
    puVar5 = (top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    if (((long)(top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Deque_impl_data._M_start._M_last - (long)puVar5 >> 2) +
        ((long)(top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Deque_impl_data._M_finish._M_cur -
         (long)(top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Deque_impl_data._M_finish._M_first >> 2) +
        ((((ulong)((long)ppuVar3 - (long)ppuVar4) >> 3) - 1) + (ulong)(ppuVar3 == (_Map_pointer)0x0)
        ) * 0x80 <= uVar12) break;
    lVar14 = (long)puVar5 -
             (long)(top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Deque_impl_data._M_start._M_first >> 2;
    uVar1 = lVar14 + uVar12;
    if (uVar1 < 0x80) {
      puVar13 = (uint *)((long)puVar5 + lVar17);
    }
    else {
      uVar15 = uVar1 >> 7 | 0xfe00000000000000;
      if (0 < (long)uVar1) {
        uVar15 = uVar1 >> 7;
      }
      puVar13 = ppuVar4[uVar15] + lVar14 + uVar15 * -0x80 + uVar12;
    }
    uVar11 = rtcGetGeometryOppositeHalfEdge(local_58,0,*puVar13);
    uVar8 = rtcGetGeometryFace(pRVar7,uVar11);
    puVar2 = (local_48->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
             ._M_start.super__Bit_iterator_base._M_p + (uVar8 >> 6);
    *puVar2 = *puVar2 | 1L << ((byte)uVar8 & 0x3f);
    local_6c = uVar11;
    local_6c = rtcGetGeometryNextHalfEdge(pRVar7,uVar11);
    if (uVar12 == 0) {
      if (*(uint **)(local_40 + 0x30) == (uint *)(*(long *)(local_40 + 0x40) + -4)) {
        std::deque<unsigned_int,std::allocator<unsigned_int>>::_M_push_back_aux<unsigned_int_const&>
                  (local_40,&local_6c);
      }
      else {
        **(uint **)(local_40 + 0x30) = local_6c;
        *(long *)(local_40 + 0x30) = *(long *)(local_40 + 0x30) + 4;
      }
    }
    local_6c = rtcGetGeometryNextHalfEdge(pRVar7,local_6c);
    puVar5 = (top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    lVar14 = (long)puVar5 -
             (long)(top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Deque_impl_data._M_start._M_first >> 2;
    uVar1 = lVar14 + uVar12;
    if (uVar1 < 0x80) {
      puVar13 = (uint *)((long)puVar5 + lVar17);
    }
    else {
      uVar15 = uVar1 >> 7 | 0xfe00000000000000;
      if (0 < (long)uVar1) {
        uVar15 = uVar1 >> 7;
      }
      puVar13 = (top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Deque_impl_data._M_start._M_node[uVar15] + lVar14 + uVar15 * -0x80 + uVar12;
    }
    *puVar13 = local_6c;
    local_6c = rtcGetGeometryNextHalfEdge(pRVar7,local_6c);
    ppuVar3 = (top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    if (uVar12 == (((long)(top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl.super__Deque_impl_data._M_finish._M_cur -
                    (long)(top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl.super__Deque_impl_data._M_finish._M_first >> 2) +
                   ((((ulong)((long)ppuVar3 -
                             (long)(top->
                                   super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                   (ulong)(ppuVar3 == (_Map_pointer)0x0)) * 0x80 +
                  ((long)(top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Deque_impl_data._M_start._M_last -
                   (long)(top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Deque_impl_data._M_start._M_cur >> 2)) - 1) {
      if (*(long *)(local_38 + 0x10) == *(long *)(local_38 + 0x18)) {
        std::deque<unsigned_int,std::allocator<unsigned_int>>::
        _M_push_front_aux<unsigned_int_const&>(local_38,&local_6c);
      }
      else {
        *(uint *)(*(long *)(local_38 + 0x10) + -4) = local_6c;
        *(long *)(local_38 + 0x10) = *(long *)(local_38 + 0x10) + -4;
      }
    }
    uVar12 = uVar12 + 1;
    lVar17 = lVar17 + 4;
  }
LAB_0014e60f:
  return uVar16 <= local_68;
}

Assistant:

bool extend_grid(RTCGeometry geom, std::vector<bool>& visited, std::deque<unsigned int>& left, std::deque<unsigned int>& top, std::deque<unsigned int>& right)
  {
    //        top
    // | <----------
    // |            /\ .
    // | left        | right 
    // |             |
    // \/            |

    
    /* test if all neighboring faces of top exist and are properly connected */
    unsigned int prev_opposite_edge = -1;
    for (size_t i=0; i<top.size(); i++)
    {
      const unsigned int edge = top[i];
      const unsigned int opposite_edge = rtcGetGeometryOppositeHalfEdge(geom,0,edge);
      if (opposite_edge == edge) return false;
      const unsigned int opposite_face = rtcGetGeometryFace(geom,opposite_edge);
      if (visited[opposite_face]) return false;

      /* test if we share an edge with the last quad */
      if (i > 0) {
        const unsigned int border0 = rtcGetGeometryOppositeHalfEdge(geom,0,rtcGetGeometryPreviousHalfEdge(geom,prev_opposite_edge));
        const unsigned int border1 = rtcGetGeometryNextHalfEdge(geom,opposite_edge);
        if (border0 != border1) return false;
      }
      prev_opposite_edge = opposite_edge;
    }

    /* extend border edges */
    for (size_t i=0; i<top.size(); i++)
    {
      const unsigned int edge = top[i];
      const unsigned int opposite_edge = rtcGetGeometryOppositeHalfEdge(geom,0,edge);
      assert(opposite_edge != edge);
      const unsigned int opposite_face = rtcGetGeometryFace(geom,opposite_edge);
      assert(!visited[opposite_face]);
      visited[opposite_face] = true;
      unsigned int next_edge = opposite_edge;
      next_edge = rtcGetGeometryNextHalfEdge(geom,next_edge);
      if (i == 0) right.push_back(next_edge);
      next_edge = rtcGetGeometryNextHalfEdge(geom,next_edge);
      top[i] = next_edge;
      next_edge = rtcGetGeometryNextHalfEdge(geom,next_edge);
      if (i == top.size()-1) left.push_front(next_edge);
    }

    return true;
  }